

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field_lite.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::java::(anonymous_namespace)::TypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field,
          ClassNameResolver *name_resolver,bool boxed)

{
  JavaType JVar1;
  Descriptor *descriptor;
  EnumDescriptor *descriptor_00;
  char *pcVar2;
  allocator local_21;
  
  JVar1 = GetJavaType((FieldDescriptor *)this);
  if (JVar1 == JAVATYPE_MESSAGE) {
    descriptor = FieldDescriptor::message_type((FieldDescriptor *)this);
    ClassNameResolver::GetClassName_abi_cxx11_
              (__return_storage_ptr__,(ClassNameResolver *)field,descriptor,true);
  }
  else {
    JVar1 = GetJavaType((FieldDescriptor *)this);
    if (JVar1 == JAVATYPE_ENUM) {
      descriptor_00 = FieldDescriptor::enum_type((FieldDescriptor *)this);
      ClassNameResolver::GetClassName_abi_cxx11_
                (__return_storage_ptr__,(ClassNameResolver *)field,descriptor_00,true);
    }
    else {
      JVar1 = GetJavaType((FieldDescriptor *)this);
      if ((char)name_resolver == '\0') {
        pcVar2 = PrimitiveTypeName(JVar1);
      }
      else {
        pcVar2 = BoxedPrimitiveTypeName(JVar1);
      }
      std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_21);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string TypeName(const FieldDescriptor* field,
                ClassNameResolver* name_resolver,
                bool boxed) {
  if (GetJavaType(field) == JAVATYPE_MESSAGE) {
    return name_resolver->GetImmutableClassName(field->message_type());
  } else if (GetJavaType(field) == JAVATYPE_ENUM) {
    return name_resolver->GetImmutableClassName(field->enum_type());
  } else {
    return boxed ? BoxedPrimitiveTypeName(GetJavaType(field))
                 : PrimitiveTypeName(GetJavaType(field));
  }
}